

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O1

DWORD GetFileSize(HANDLE hFile,LPDWORD lpFileSizeHigh)

{
  PAL_ERROR PVar1;
  undefined8 in_RAX;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  undefined8 uStack_28;
  DWORD dwFileSizeLow;
  
  uStack_28 = in_RAX;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    PVar1 = CorUnix::InternalGetFileSize
                      (pThread,hFile,(DWORD *)((long)&uStack_28 + 4),lpFileSizeHigh);
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
      uStack_28 = CONCAT44(0xffffffff,(undefined4)uStack_28);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return uStack_28._4_4_;
    }
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetFileSize(
        IN HANDLE hFile,
        OUT LPDWORD lpFileSizeHigh)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    DWORD dwFileSizeLow;

    PERF_ENTRY(GetFileSize);
    ENTRY("GetFileSize(hFile=%p, lpFileSizeHigh=%p)\n", hFile, lpFileSizeHigh);

    pThread = InternalGetCurrentThread();

    palError = InternalGetFileSize(
        pThread,
        hFile, 
        &dwFileSizeLow,
        lpFileSizeHigh
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
        dwFileSizeLow = INVALID_FILE_SIZE;
    }

    LOGEXIT("GetFileSize returns DWORD %u\n", dwFileSizeLow);
    PERF_EXIT(GetFileSize);
    return dwFileSizeLow;
}